

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void obj_to_char(OBJ_DATA *obj,CHAR_DATA *ch)

{
  int iVar1;
  CHAR_DATA *in_RSI;
  OBJ_DATA *in_RDI;
  
  in_RDI->next_content = in_RSI->carrying;
  in_RSI->carrying = in_RDI;
  in_RDI->carried_by = in_RSI;
  in_RDI->in_room = (ROOM_INDEX_DATA *)0x0;
  in_RDI->in_obj = (OBJ_DATA *)0x0;
  iVar1 = get_obj_number(in_RDI);
  in_RSI->carry_number = in_RSI->carry_number + (short)iVar1;
  iVar1 = get_obj_weight((OBJ_DATA *)in_RSI);
  in_RSI->carry_weight = in_RSI->carry_weight + (short)iVar1;
  return;
}

Assistant:

void obj_to_char(OBJ_DATA *obj, CHAR_DATA *ch)
{
	obj->next_content = ch->carrying;
	ch->carrying = obj;
	obj->carried_by = ch;
	obj->in_room = nullptr;
	obj->in_obj = nullptr;
	ch->carry_number += get_obj_number(obj);
	ch->carry_weight += get_obj_weight(obj);
}